

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

AssertionResult __thiscall
testing::internal::FloatingPointLE<double>
          (internal *this,char *expr1,char *expr2,double val1,double val2)

{
  bool bVar1;
  AssertionResult *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar3;
  char *expr2_local;
  char *expr1_local;
  AssertionResult local_3a0;
  FloatingPoint<double> rhs;
  FloatingPoint<double> lhs;
  string local_380;
  string local_360;
  stringstream val1_ss;
  long local_330;
  undefined8 auStack_328 [46];
  stringstream val2_ss;
  long local_1a8;
  undefined8 auStack_1a0 [46];
  
  if (val2 <= val1) {
    expr2_local = expr2;
    expr1_local = expr1;
    rhs.u_ = (FloatingPointUnion)val2;
    lhs.u_ = (FloatingPointUnion)val1;
    bVar1 = FloatingPoint<double>::AlmostEquals(&lhs,&rhs);
    expr2 = (char *)extraout_RDX;
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&val1_ss);
      *(undefined8 *)((long)auStack_328 + *(long *)(local_330 + -0x18)) = 0x11;
      std::ostream::_M_insert<double>(val1);
      std::__cxx11::stringstream::stringstream((stringstream *)&val2_ss);
      *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1a8 + -0x18)) = 0x11;
      std::ostream::_M_insert<double>(val2);
      local_3a0.success_ = false;
      local_3a0.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar2 = AssertionResult::operator<<(&local_3a0,(char (*) [12])"Expected: (");
      pAVar2 = AssertionResult::operator<<(pAVar2,&expr1_local);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])") <= (");
      pAVar2 = AssertionResult::operator<<(pAVar2,&expr2_local);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x290794);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0x2800c8);
      StringStreamToString(&local_360,&val1_ss);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_360);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" vs ");
      StringStreamToString(&local_380,&val2_ss);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_380);
      AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&local_3a0.message_);
      std::__cxx11::stringstream::~stringstream((stringstream *)&val2_ss);
      std::__cxx11::stringstream::~stringstream((stringstream *)&val1_ss);
      expr2 = (char *)extraout_RDX_00;
      goto LAB_00218980;
    }
  }
  *this = (internal)0x1;
  *(undefined8 *)(this + 8) = 0;
LAB_00218980:
  AVar3.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expr2;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult FloatingPointLE(const char* expr1,
                                const char* expr2,
                                RawType val1,
                                RawType val2) {
  // Returns success if val1 is less than val2,
  if (val1 < val2) {
    return AssertionSuccess();
  }

  // or if val1 is almost equal to val2.
  const FloatingPoint<RawType> lhs(val1), rhs(val2);
  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  // Note that the above two checks will both fail if either val1 or
  // val2 is NaN, as the IEEE floating-point standard requires that
  // any predicate involving a NaN must return false.

  ::std::stringstream val1_ss;
  val1_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val1;

  ::std::stringstream val2_ss;
  val2_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
          << val2;

  return AssertionFailure()
      << "Expected: (" << expr1 << ") <= (" << expr2 << ")\n"
      << "  Actual: " << StringStreamToString(&val1_ss) << " vs "
      << StringStreamToString(&val2_ss);
}